

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int sasl_init_set_initial_response(SASL_INIT_HANDLE sasl_init,amqp_binary initial_response_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  SASL_INIT_INSTANCE *sasl_init_instance;
  amqp_binary value;
  
  if (sasl_init == (SASL_INIT_HANDLE)0x0) {
    iVar2 = 0x2a64;
  }
  else {
    value._12_4_ = 0;
    value.bytes = (void *)SUB128(initial_response_value._0_12_,0);
    value.length = SUB124(initial_response_value._0_12_,8);
    item_value = amqpvalue_create_binary(value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x2a6c;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(sasl_init->composite_value,1,item_value);
      iVar2 = 0x2a72;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int sasl_init_set_initial_response(SASL_INIT_HANDLE sasl_init, amqp_binary initial_response_value)
{
    int result;

    if (sasl_init == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SASL_INIT_INSTANCE* sasl_init_instance = (SASL_INIT_INSTANCE*)sasl_init;
        AMQP_VALUE initial_response_amqp_value = amqpvalue_create_binary(initial_response_value);
        if (initial_response_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(sasl_init_instance->composite_value, 1, initial_response_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(initial_response_amqp_value);
        }
    }

    return result;
}